

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_21daf9::MiniscriptDescriptor::MaxSatisfactionElems(MiniscriptDescriptor *this)

{
  long lVar1;
  optional<unsigned_int> oVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  oVar2 = miniscript::Node<unsigned_int>::GetStackSize
                    ((this->m_node).
                     super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value =
         (ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0xffffffff;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = (ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 0xffffffffffffff01;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionElems() const override {
        return m_node->GetStackSize();
    }